

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread_unix.cpp
# Opt level: O0

__pid_t __thiscall QThreadPrivate::wait(QThreadPrivate *this,void *__stat_loc)

{
  QDeadlineTimer deadline;
  bool bVar1;
  uint uVar2;
  _func_void_void_ptr *__fct;
  QMutex *__stat_loc_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_FS_OFFSET;
  bool mustJoin;
  bool result;
  int HasJoinerBit;
  __pthread_cleanup_class __clframe;
  anon_class_24_3_6281a61c doJoin;
  timespec *pts;
  timespec ts;
  __pthread_cleanup_class *in_stack_ffffffffffffff10;
  qint64 in_stack_ffffffffffffff40;
  anon_class_24_3_6281a61c *in_stack_ffffffffffffff48;
  bool local_ad;
  __0 local_81;
  undefined1 local_80 [24];
  QThreadPrivate *local_68;
  void *local_60;
  undefined1 ***local_58;
  undefined8 local_50;
  undefined8 local_48;
  timespec local_40;
  undefined1 **local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = (undefined1 **)0x0;
  local_18 = in_RDX;
  uStack_10 = in_RCX;
  bVar1 = QDeadlineTimer::isForever((QDeadlineTimer *)in_stack_ffffffffffffff10);
  if (!bVar1) {
    local_50 = local_18;
    local_48 = uStack_10;
    deadline._8_8_ = in_stack_ffffffffffffff48;
    deadline.t1 = in_stack_ffffffffffffff40;
    local_40 = deadlineToAbstime<1>(deadline);
    local_28 = (undefined1 *)local_40.tv_sec;
    local_20 = (undefined1 *)local_40.tv_nsec;
    local_30 = &local_28;
  }
  local_58 = &local_30;
  local_ad = false;
  this->waiters = this->waiters + 1;
  uVar2 = this->waiters;
  local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = this;
  local_60 = __stat_loc;
  __fct = wait(QMutexLocker&,QDeadlineTimer)::$_0::operator_cast_to_function_pointer(&local_81);
  __pthread_cleanup_class::__pthread_cleanup_class
            ((__pthread_cleanup_class *)local_80,__fct,&this->waiters);
  while (((uVar2 & 0x80000000) != 0 || ((this->data->isAdopted & 1U) != 0))) {
    __stat_loc_00 = QMutexLocker<QMutex>::mutex((QMutexLocker<QMutex> *)__stat_loc);
    uVar2 = QWaitCondition::wait(&this->thread_done,__stat_loc_00);
    if (((uVar2 & 1) == 0) || (local_ad = this->threadState == Finished, local_ad))
    goto LAB_006b7171;
    uVar2 = this->waiters;
  }
  local_ad = wait::anon_class_24_3_6281a61c::operator()(in_stack_ffffffffffffff48);
LAB_006b7171:
  __pthread_cleanup_class::__setdoit((__pthread_cleanup_class *)local_80,1);
  __pthread_cleanup_class::~__pthread_cleanup_class(in_stack_ffffffffffffff10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (__pid_t)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_ad);
}

Assistant:

bool QThreadPrivate::wait(QMutexLocker<QMutex> &locker, QDeadlineTimer deadline)
{
    constexpr int HasJoinerBit = int(0x8000'0000);  // a.k.a. sign bit
    struct timespec ts, *pts = nullptr;
    if (!deadline.isForever()) {
        ts = deadlineToAbstime(deadline);
        pts = &ts;
    }

    auto doJoin = [&] {
        // pthread_join() & family are cancellation points
        struct CancelState {
            QThreadPrivate *d;
            QMutexLocker<QMutex> *locker;
            int joinResult = ETIMEDOUT;
            static void run(void *arg) { static_cast<CancelState *>(arg)->run(); }
            void run()
            {
                locker->relock();
                if (joinResult == ETIMEDOUT && d->waiters)
                    d->thread_done.wakeOne();
                else if (joinResult == 0)
                    wakeAllInternal(d);
                d->waiters &= ~HasJoinerBit;
            }
        } nocancel = { this, &locker };
        int &r = nocancel.joinResult;

        // we're going to perform the join, so don't let other threads do it
        waiters |= HasJoinerBit;
        locker.unlock();

        pthread_cleanup_push(&CancelState::run, &nocancel);
        pthread_t thrId = from_HANDLE<pthread_t>(data->threadId.loadRelaxed());
        if constexpr (QT_CONFIG(pthread_clockjoin))
            r = pthread_clockjoin_np(thrId, nullptr, SteadyClockClockId, pts);
        else
            r = pthread_timedjoin_np(thrId, nullptr, pts);
        Q_ASSERT(r == 0 || r == ETIMEDOUT);
        pthread_cleanup_pop(1);

        Q_ASSERT(waiters >= 0);
        return r != ETIMEDOUT;
    };
    Q_ASSERT(threadState != QThreadPrivate::Finished);
    Q_ASSERT(locker.isLocked());

    bool result = false;

    // both branches call cancellation points
    ++waiters;
    bool mustJoin = (waiters & HasJoinerBit) == 0;
    pthread_cleanup_push([](void *ptr) {
        --(*static_cast<decltype(waiters) *>(ptr));
    }, &waiters);
    for (;;) {
        if (UsingPThreadTimedJoin && mustJoin && !data->isAdopted) {
            result = doJoin();
            break;
        }
        if (!thread_done.wait(locker.mutex(), deadline))
            break;      // timed out
        result = threadState == QThreadPrivate::Finished;
        if (result)
            break;      // success
        mustJoin = (waiters & HasJoinerBit) == 0;
    }
    pthread_cleanup_pop(1);

    return result;
}